

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_array2d.h
# Opt level: O0

Array2D<double> * __thiscall TNT::Array2D<double>::ref(Array2D<double> *this,Array2D<double> *A)

{
  Array2D<double> *A_local;
  Array2D<double> *this_local;
  
  if (this != A) {
    Array1D<double_*>::operator=(&this->v_,&A->v_);
    Array1D<double>::operator=(&this->data_,&A->data_);
    this->m_ = A->m_;
    this->n_ = A->n_;
  }
  return this;
}

Assistant:

Array2D<T> & Array2D<T>::ref(const Array2D<T> &A)
{
	if (this != &A)
	{
		v_ = A.v_;
		data_ = A.data_;
		m_ = A.m_;
		n_ = A.n_;
		
	}
	return *this;
}